

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall
cfd::core::Psbt::Psbt(Psbt *this,uint32_t psbt_version,uint32_t version,uint32_t lock_time)

{
  CfdException *pCVar1;
  int ret;
  wally_psbt *psbt_pointer;
  int local_ac;
  wally_psbt *local_a8;
  undefined1 local_a0 [64];
  wally_tx local_60;
  
  this->_vptr_Psbt = (_func_int **)&PTR__Psbt_0072eab0;
  Transaction::Transaction(&this->base_tx_);
  local_a8 = (wally_psbt *)0x0;
  local_ac = wally_psbt_init_alloc(psbt_version,0,0,0,&local_a8);
  if (local_ac != 0) {
    local_a0._0_8_ = "cfdcore_psbt.cpp";
    local_a0._8_4_ = 0x6f2;
    local_a0._16_8_ = (long)"CfdIsFinalizedPsbt" + 0xe;
    logger::log<int&>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,
                      "wally_psbt_init_alloc NG[{}]",&local_ac);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a0._0_8_ = local_a0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"psbt data generate error.","");
    CfdException::CfdException(pCVar1,kCfdInternalError,(string *)local_a0);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_60.num_outputs = 0;
  local_60.outputs_allocation_len = 0;
  local_60.inputs_allocation_len = 0;
  local_60.outputs = (wally_tx_output *)0x0;
  local_60.inputs = (wally_tx_input *)0x0;
  local_60.num_inputs = 0;
  local_60.version = version;
  local_60.locktime = lock_time;
  local_ac = wally_psbt_set_global_tx(local_a8,&local_60);
  if (local_ac == 0) {
    this->wally_psbt_pointer_ = local_a8;
    RebuildTransaction((Transaction *)local_a0,local_a8);
    Transaction::operator=(&this->base_tx_,(Transaction *)local_a0);
    Transaction::~Transaction((Transaction *)local_a0);
    return;
  }
  wally_psbt_free(local_a8);
  local_a0._0_8_ = "cfdcore_psbt.cpp";
  local_a0._8_4_ = 0x6fd;
  local_a0._16_8_ = (long)"CfdIsFinalizedPsbt" + 0xe;
  logger::log<int&>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,
                    "wally_psbt_set_global_tx NG[{}]",&local_ac);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_a0._0_8_ = local_a0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"psbt set tx error.","");
  CfdException::CfdException(pCVar1,kCfdInternalError,(string *)local_a0);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, uint32_t version, uint32_t lock_time) {
  struct wally_psbt *psbt_pointer = nullptr;
  int ret = wally_psbt_init_alloc(psbt_version, 0, 0, 0, &psbt_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_init_alloc NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt data generate error.");
  }

  struct wally_tx tx;
  memset(&tx, 0, sizeof(tx));
  tx.version = version;
  tx.locktime = lock_time;
  ret = wally_psbt_set_global_tx(psbt_pointer, &tx);
  if (ret != WALLY_OK) {
    wally_psbt_free(psbt_pointer);  // free
    warn(CFD_LOG_SOURCE, "wally_psbt_set_global_tx NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt set tx error.");
  }
  wally_psbt_pointer_ = psbt_pointer;
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}